

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O2

uint8_t * __thiscall pktalloc::Allocator::allocateFromNewWindow(Allocator *this,uint units)

{
  uint uVar1;
  bool bVar2;
  WindowHeader *this_00;
  uint8_t *puVar3;
  
  this_00 = (WindowHeader *)SIMDSafeAllocate(0x10120);
  if (this_00 == (WindowHeader *)0x0) {
    puVar3 = (uint8_t *)0x0;
  }
  else {
    CustomBitSet<2048U>::ClearAll((CustomBitSet<2048U> *)this_00);
    CustomBitSet<2048U>::SetRange((CustomBitSet<2048U> *)this_00,0,units);
    this_00->FreeUnitCount = 0x800 - units;
    this_00->ResumeScanOffset = units;
    this_00->Preallocated = false;
    this_00->FullListIndex = -1;
    uVar1 = (this->PreferredWindows).Size;
    bVar2 = LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_Copy
                      (&this->PreferredWindows,uVar1 + 1);
    if (bVar2) {
      (this->PreferredWindows).DataPtr[uVar1] = this_00;
    }
    *(WindowHeader **)&this_00[1].field_0x10 = this_00;
    *(uint *)&this_00[1].field_0x18 = units;
    puVar3 = &this_00[1].field_0x30;
  }
  return puVar3;
}

Assistant:

uint8_t* Allocator::allocateFromNewWindow(unsigned units)
{
    ALLOC_DEBUG_INTEGRITY_CHECK();

    uint8_t* headerStart = SIMDSafeAllocate(kWindowSizeBytes);
    if (!headerStart) {
        return nullptr; // Allocation failure
    }

    // Update window header
    WindowHeader* window = (WindowHeader*)headerStart;
    window->Used.ClearAll();
    window->Used.SetRange(0, units);
    window->FreeUnitCount = kWindowMaxUnits - units;
    window->ResumeScanOffset = units;
    window->Preallocated = false;
    PKTALLOC_DEBUG_ASSERT(PreferredWindows.GetSize() == 0);
    window->FullListIndex = kNotInFullList;
    PreferredWindows.Append(window);

    // Carve out region
    AllocationHeader* regionHeader = (AllocationHeader*)(headerStart + kWindowHeaderBytes);
#ifdef PKTALLOC_DEBUG
    regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
    regionHeader->Header = window;
    regionHeader->UsedUnits = units;

    uint8_t* data = (uint8_t*)regionHeader + kUnitSize;
#ifdef PKTALLOC_SCRUB_MEMORY
    memset(data, 0, (units - 1) * kUnitSize);
#endif // PKTALLOC_SCRUB_MEMORY
    PKTALLOC_DEBUG_ASSERT((uintptr_t)data % kUnitSize == 0);

    ALLOC_DEBUG_INTEGRITY_CHECK();

    return data;
}